

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O3

string * __thiscall
cmCPackIFWGenerator::GetComponentInstallDirNameSuffix
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this,string *componentName)

{
  long lVar1;
  mapped_type *component;
  long *plVar2;
  size_type *psVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string suffix;
  string prefix;
  string local_c0;
  long *local_a0;
  undefined8 local_98;
  long local_90 [2];
  long *local_80;
  size_type *local_78;
  long local_70 [2];
  basic_string_view<char,_std::char_traits<char>_> local_60;
  size_type local_50;
  pointer pcStack_48;
  undefined8 local_40;
  long *local_38;
  
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"packages/","");
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/data","");
  local_60._M_str = (char *)local_80;
  if ((this->super_cmCPackGenerator).componentPackageMethod == ONE_PACKAGE) {
    GetRootPackageName_abi_cxx11_(&local_c0,this);
    local_60._M_len = (size_t)local_78;
    local_50 = local_c0._M_string_length;
    pcStack_48 = local_c0._M_dataplus._M_p;
    local_40 = local_98;
    local_38 = local_a0;
    views._M_len = 3;
    views._M_array = &local_60;
    cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  }
  else {
    component = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                ::operator[](&(this->super_cmCPackGenerator).Components,componentName);
    GetComponentPackageName_abi_cxx11_(&local_c0,this,component);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_80);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar3) {
      local_50 = *psVar3;
      pcStack_48 = (pointer)plVar2[3];
      local_60._M_len = (size_t)&local_50;
    }
    else {
      local_50 = *psVar3;
      local_60._M_len = (size_t)*plVar2;
    }
    local_60._M_str = (char *)plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_a0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar3) {
      lVar1 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((size_type *)local_60._M_len != &local_50) {
      operator_delete((void *)local_60._M_len,local_50 + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWGenerator::GetComponentInstallDirNameSuffix(
  const std::string& componentName)
{
  const std::string prefix = "packages/";
  const std::string suffix = "/data";

  if (this->componentPackageMethod == this->ONE_PACKAGE) {
    return cmStrCat(prefix, this->GetRootPackageName(), suffix);
  }

  return prefix +
    this->GetComponentPackageName(&this->Components[componentName]) + suffix;
}